

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.H
# Opt level: O0

void amrex::EB2::Build<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>
               (GeometryShop<amrex::EB2::CylinderIF,_int> *gshop,Geometry *geom,
               int required_coarsening_level,int max_coarsening_level,int ngrow,
               bool build_coarse_level_by_coarsening,bool extend_domain_face,int num_coarsen_opt)

{
  IndexSpace *in_RDI;
  undefined1 in_stack_00000272;
  undefined1 in_stack_00000273;
  int in_stack_00000274;
  int in_stack_00000278;
  int in_stack_0000027c;
  Geometry *in_stack_00000280;
  GeometryShop<amrex::EB2::CylinderIF,_int> *in_stack_00000288;
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_> *in_stack_00000290;
  int in_stack_00000450;
  
  operator_new(0xb0);
  IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,_int>_>::IndexSpaceImp
            (in_stack_00000290,in_stack_00000288,in_stack_00000280,in_stack_0000027c,
             in_stack_00000278,in_stack_00000274,(bool)in_stack_00000273,(bool)in_stack_00000272,
             in_stack_00000450);
  IndexSpace::push(in_RDI);
  return;
}

Assistant:

void
Build (const G& gshop, const Geometry& geom,
       int required_coarsening_level, int max_coarsening_level,
       int ngrow = 4, bool build_coarse_level_by_coarsening = true,
       bool extend_domain_face = ExtendDomainFace(),
       int num_coarsen_opt = NumCoarsenOpt())
{
    BL_PROFILE("EB2::Initialize()");
    IndexSpace::push(new IndexSpaceImp<G>(gshop, geom,
                                          required_coarsening_level,
                                          max_coarsening_level,
                                          ngrow, build_coarse_level_by_coarsening,
                                          extend_domain_face,
                                          num_coarsen_opt));
}